

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra.cc
# Opt level: O2

void __thiscall OutputRedirect::OutputRedirect(OutputRedirect *this,FILE *file)

{
  int __fd;
  undefined8 in_RAX;
  int __fd2;
  int __fd_00;
  File write_end;
  undefined8 local_28;
  
  this->file_ = file;
  this->original_ = -1;
  this->read_end_ = -1;
  local_28 = in_RAX;
  flush(this);
  __fd = fileno((FILE *)file);
  __fd_00 = __fd;
  fmt::File::dup((File *)((long)&local_28 + 4),__fd);
  fmt::File::close(&this->original_,__fd_00);
  (this->original_).fd_ = local_28._4_4_;
  local_28._4_4_ = 0xffffffff;
  fmt::File::~File((File *)((long)&local_28 + 4));
  local_28 = CONCAT44(local_28._4_4_,0xffffffff);
  fmt::File::pipe(&this->read_end_,(int *)&local_28);
  fmt::File::dup2((File *)&local_28,__fd,__fd2);
  fmt::File::~File((File *)&local_28);
  return;
}

Assistant:

OutputRedirect::OutputRedirect(FILE *file) : file_(file) {
  flush();
  int fd = FMT_POSIX(fileno(file));
  // Create a File object referring to the original file.
  original_ = File::dup(fd);
  // Create a pipe.
  File write_end;
  File::pipe(read_end_, write_end);
  // Connect the passed FILE object to the write end of the pipe.
  write_end.dup2(fd);
}